

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O1

void ssh2_bpp_new_incoming_crypto
               (BinaryPacketProtocol *bpp,ssh_cipheralg *cipher,void *ckey,void *iv,ssh2_macalg *mac
               ,_Bool etm_mode,void *mac_key,ssh_compression_alg *compression,
               _Bool delayed_compression)

{
  long *plVar1;
  LogContext *pLVar2;
  ssh_cipher *psVar3;
  char *pcVar4;
  IdempotentCallback *pIVar5;
  undefined8 uVar6;
  ssh_decompressor *psVar7;
  char *pcVar8;
  ptrlen pVar9;
  
  if (bpp->vt != &ssh2_bpp_vtable) {
    __assert_fail("bpp->vt == &ssh2_bpp_vtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0xb7,
                  "void ssh2_bpp_new_incoming_crypto(BinaryPacketProtocol *, const ssh_cipheralg *, const void *, const void *, const ssh2_macalg *, _Bool, const void *, const ssh_compression_alg *, _Bool)"
                 );
  }
  ssh2_bpp_free_incoming_crypto((ssh2_bpp_state *)&bpp[-2].remote_bugs);
  if (cipher == (ssh_cipheralg *)0x0) {
    bpp[-1].out_pq.pqb.total_size = 0;
  }
  else {
    psVar3 = (*cipher->new)(cipher);
    bpp[-1].out_pq.pqb.total_size = (size_t)psVar3;
    (*psVar3->vt->setkey)(psVar3,ckey);
    plVar1 = (long *)bpp[-1].out_pq.pqb.total_size;
    (**(code **)(*plVar1 + 0x10))(plVar1,iv);
    pLVar2 = bpp->logctx;
    pcVar4 = dupprintf("Initialised %s inbound encryption",
                       *(undefined8 *)(*(long *)bpp[-1].out_pq.pqb.total_size + 0x58));
    logevent_and_free(pLVar2,pcVar4);
  }
  *(_Bool *)&bpp[-1].out_pq.after = etm_mode;
  if (mac == (ssh2_macalg *)0x0) {
    bpp[-1].out_pq.pqb.ic = (IdempotentCallback *)0x0;
  }
  else {
    pIVar5 = (IdempotentCallback *)(*mac->new)(mac,(ssh_cipher *)bpp[-1].out_pq.pqb.total_size);
    bpp[-1].out_pq.pqb.ic = pIVar5;
    pVar9.len = (size_t)mac->keylen;
    pVar9.ptr = mac_key;
    (*((ssh2_macalg *)pIVar5->fn)->setkey)((ssh2_mac *)pIVar5,pVar9);
    pLVar2 = bpp->logctx;
    uVar6 = (**(code **)((bpp[-1].out_pq.pqb.ic)->fn + 0x28))();
    pcVar8 = " (in ETM mode)";
    pcVar4 = anon_var_dwarf_34748 + 10;
    if (!etm_mode) {
      pcVar8 = anon_var_dwarf_34748 + 10;
    }
    plVar1 = (long *)bpp[-1].out_pq.pqb.total_size;
    if ((plVar1 != (long *)0x0) &&
       (pcVar4 = " (required by cipher)", *(long *)(*plVar1 + 0x60) == 0)) {
      pcVar4 = anon_var_dwarf_34748 + 10;
    }
    pcVar4 = dupprintf("Initialised %s inbound MAC algorithm%s%s",uVar6,pcVar8,pcVar4);
    logevent_and_free(pLVar2,pcVar4);
  }
  if ((delayed_compression) && (bpp[-1].ic_out_pq.field_0x13 == '\0')) {
    bpp[-1].pls = (PacketLogSettings *)compression;
    bpp[-1].ic_out_pq.fn = (toplevel_callback_fn_t)0x0;
    pcVar4 = "Will enable %s decompression after user authentication";
  }
  else {
    bpp[-1].pls = (PacketLogSettings *)0x0;
    psVar7 = (*compression->decompress_new)();
    bpp[-1].ic_out_pq.fn = (toplevel_callback_fn_t)psVar7;
    if (psVar7 == (ssh_decompressor *)0x0) goto LAB_0011cf83;
    compression = psVar7->vt;
    pcVar4 = "Initialised %s decompression";
  }
  pLVar2 = bpp->logctx;
  pcVar4 = dupprintf(pcVar4,compression->text_name);
  logevent_and_free(pLVar2,pcVar4);
LAB_0011cf83:
  bpp[-1].ic_out_pq.field_0x11 = 0;
  queue_idempotent_callback(&bpp->ic_in_raw);
  return;
}

Assistant:

void ssh2_bpp_new_incoming_crypto(
    BinaryPacketProtocol *bpp,
    const ssh_cipheralg *cipher, const void *ckey, const void *iv,
    const ssh2_macalg *mac, bool etm_mode, const void *mac_key,
    const ssh_compression_alg *compression, bool delayed_compression)
{
    struct ssh2_bpp_state *s;
    assert(bpp->vt == &ssh2_bpp_vtable);
    s = container_of(bpp, struct ssh2_bpp_state, bpp);

    ssh2_bpp_free_incoming_crypto(s);

    if (cipher) {
        s->in.cipher = ssh_cipher_new(cipher);
        ssh_cipher_setkey(s->in.cipher, ckey);
        ssh_cipher_setiv(s->in.cipher, iv);

        bpp_logevent("Initialised %s inbound encryption",
                     ssh_cipher_alg(s->in.cipher)->text_name);
    } else {
        s->in.cipher = NULL;
    }
    s->in.etm_mode = etm_mode;
    if (mac) {
        s->in.mac = ssh2_mac_new(mac, s->in.cipher);
        ssh2_mac_setkey(s->in.mac, make_ptrlen(mac_key, mac->keylen));

        bpp_logevent("Initialised %s inbound MAC algorithm%s%s",
                     ssh2_mac_text_name(s->in.mac),
                     etm_mode ? " (in ETM mode)" : "",
                     (s->in.cipher &&
                      ssh_cipher_alg(s->in.cipher)->required_mac ?
                      " (required by cipher)" : ""));
    } else {
        s->in.mac = NULL;
    }

    if (delayed_compression && !s->seen_userauth_success) {
        s->in.pending_compression = compression;
        s->in_decomp = NULL;

        bpp_logevent("Will enable %s decompression after user authentication",
                     s->in.pending_compression->text_name);
    } else {
        s->in.pending_compression = NULL;

        /* 'compression' is always non-NULL, because no compression is
         * indicated by ssh_comp_none. But this setup call may return a
         * null in_decomp. */
        s->in_decomp = ssh_decompressor_new(compression);

        if (s->in_decomp)
            bpp_logevent("Initialised %s decompression",
                         ssh_decompressor_alg(s->in_decomp)->text_name);
    }

    /* Clear the pending_newkeys flag, so that handle_input below will
     * start consuming the input data again. */
    s->pending_newkeys = false;

    /* And schedule a run of handle_input, in case there's already
     * input data in the queue. */
    queue_idempotent_callback(&s->bpp.ic_in_raw);
}